

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

int __thiscall
DirectChainedMap<IdentifierLookupResult>::remove
          (DirectChainedMap<IdentifierLookupResult> *this,char *__filename)

{
  Node *pNVar1;
  Node *pNVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *puVar7;
  long in_RCX;
  long in_RDX;
  Node *pNVar8;
  long lVar9;
  Node *pNVar10;
  Node *pNVar11;
  
  puVar7 = (undefined8 *)((ulong)__filename & 0xffffffff);
  lVar9 = (ulong)(this->bucketCount - 1 & (uint)__filename) * 0x20;
  pNVar2 = *(Node **)(this->data + lVar9 + 0x18);
  if (pNVar2 == (Node *)0x0) {
    __assert_fail("!\"element is not in the map\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x1b7,
                  "void DirectChainedMap<IdentifierLookupResult>::remove(unsigned int, Value) [Value = IdentifierLookupResult]"
                 );
  }
  pNVar8 = this->data + lVar9;
  pNVar10 = (Node *)0x0;
  pNVar11 = pNVar8;
  while( true ) {
    if (pNVar11 == (Node *)0x0) {
      this->count = this->count - 1;
      __assert_fail("curr && \"element is not in the map\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x1c9,
                    "void DirectChainedMap<IdentifierLookupResult>::remove(unsigned int, Value) [Value = IdentifierLookupResult]"
                   );
    }
    if (((*(uint *)pNVar11 == (uint)__filename) && (*(long *)(pNVar11 + 8) == in_RDX)) &&
       (*(long *)(pNVar11 + 0x10) == in_RCX)) break;
    pNVar1 = pNVar11 + 0x18;
    pNVar10 = pNVar11;
    pNVar11 = *(Node **)pNVar1;
    if (*(Node **)pNVar1 == pNVar8) {
LAB_00206f10:
      return (int)puVar7;
    }
  }
  this->count = this->count - 1;
  if (pNVar10 != (Node *)0x0) {
    *(undefined8 *)(pNVar10 + 0x18) = *(undefined8 *)(pNVar11 + 0x18);
    iVar6 = (*this->allocator->_vptr_Allocator[3])(this->allocator,pNVar11);
    return iVar6;
  }
  if (pNVar2 == pNVar8) {
    *(undefined8 *)(pNVar8 + 0x18) = 0;
  }
  else {
    (*this->allocator->_vptr_Allocator[3])();
    puVar7 = *(undefined8 **)(pNVar8 + 0x18);
    uVar3 = puVar7[1];
    uVar4 = puVar7[2];
    uVar5 = puVar7[3];
    *(undefined8 *)pNVar8 = *puVar7;
    *(undefined8 *)(pNVar8 + 8) = uVar3;
    *(undefined8 *)(pNVar8 + 0x10) = uVar4;
    *(undefined8 *)(pNVar8 + 0x18) = uVar5;
  }
  goto LAB_00206f10;
}

Assistant:

void remove(unsigned hash, Value value)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;
		Node *prev = NULL;

		if(!curr->next)
		{
			assert(!"element is not in the map");
			return;
		}

		while(curr)
		{
			if(curr->hash == hash && curr->value == value)
				break;

			prev = curr;
			curr = curr->next;

			if(curr == start)
				return;
		}

		count--;

		assert(curr && "element is not in the map");

		if(prev)
		{
			prev->next = curr->next;

			allocator->dealloc(curr);
		}
		else if(start->next == start)
		{
			start->next = NULL;
		}
		else
		{
			allocator->dealloc(start->next);

			*start = *start->next;
		}
	}